

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

void __thiscall
iutest::detail::
iuConcatParamHolder<iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<bool>_>
::params_t<int>::append<bool>(params_t<int> *this,iuParamGenerator<bool> *gen)

{
  int iVar1;
  uint local_1c;
  
  (*gen->m_pInterface->_vptr_iuIParamGenerator[2])();
  while( true ) {
    iVar1 = (*gen->m_pInterface->_vptr_iuIParamGenerator[5])();
    if ((char)iVar1 != '\0') break;
    local_1c = (*gen->m_pInterface->_vptr_iuIParamGenerator[3])();
    local_1c = local_1c & 0xff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->val,(int *)&local_1c);
    (*gen->m_pInterface->_vptr_iuIParamGenerator[4])();
  }
  return;
}

Assistant:

void append(iuParamGenerator<U>& gen)
        {
            for( gen.Begin(); !gen.IsEnd(); gen.Next() )
            {
                val.push_back(static_cast<T>(gen.GetCurrent()));
            }
        }